

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

void __thiscall
Json::OurCharReader::OurCharReader(OurCharReader *this,bool collectComments,OurFeatures *features)

{
  OurImpl *this_00;
  
  this_00 = (OurImpl *)operator_new(0x140);
  OurImpl::OurImpl(this_00,collectComments,features);
  (this->super_CharReader)._impl._M_t.
  super___uniq_ptr_impl<Json::CharReader::Impl,_std::default_delete<Json::CharReader::Impl>_>._M_t.
  super__Tuple_impl<0UL,_Json::CharReader::Impl_*,_std::default_delete<Json::CharReader::Impl>_>.
  super__Head_base<0UL,_Json::CharReader::Impl_*,_false>._M_head_impl = (Impl *)this_00;
  (this->super_CharReader)._vptr_CharReader = (_func_int **)&PTR__CharReader_00149b68;
  return;
}

Assistant:

OurCharReader(bool collectComments, OurFeatures const& features)
      : CharReader(
            std::unique_ptr<OurImpl>(new OurImpl(collectComments, features))) {}